

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O3

void __thiscall
duckdb::DuckSchemaEntry::DropEntry(DuckSchemaEntry *this,ClientContext *context,DropInfo *info)

{
  pointer pcVar1;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  CatalogTransaction transaction_02;
  bool bVar2;
  CatalogSet *this_00;
  reference this_01;
  type pAVar3;
  CatalogException *this_02;
  InternalException *pIVar4;
  CatalogType type;
  CatalogType type_00;
  DuckSchemaEntry *this_03;
  size_type __n;
  optional_ptr<duckdb::CatalogEntry,_true> existing_entry;
  vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
  fk_arrays;
  CatalogTransaction transaction;
  undefined1 local_170 [8];
  string local_168;
  undefined1 local_148 [24];
  CatalogTransaction local_130;
  DatabaseInstance *local_108;
  Val VStack_100;
  element_type *peStack_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  DatabaseInstance *local_d8;
  __node_base _Stack_d0;
  Transaction *local_c8;
  element_type *peStack_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  this_00 = GetCatalogSet(this,(info->super_ParseInfo).field_0x9);
  CatalogTransaction::CatalogTransaction
            (&local_130,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,context);
  transaction_00.context.ptr._0_4_ = (int)local_130.context.ptr;
  transaction_00.db.ptr = local_130.db.ptr;
  transaction_00.context.ptr._4_4_ = (int)((ulong)local_130.context.ptr >> 0x20);
  transaction_00.transaction.ptr._0_4_ = (int)local_130.transaction.ptr;
  transaction_00.transaction.ptr._4_4_ = (int)((ulong)local_130.transaction.ptr >> 0x20);
  transaction_00.transaction_id._0_4_ = (int)local_130.transaction_id;
  transaction_00.transaction_id._4_4_ = (int)(local_130.transaction_id >> 0x20);
  transaction_00.start_time = local_130.start_time;
  local_170 = (undefined1  [8])CatalogSet::GetEntry(this_00,transaction_00,&info->name);
  if (local_170 == (undefined1  [8])0x0) {
    pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_170 + 8),"Failed to drop entry \"%s\" - entry could not be found",""
              );
    local_90._0_8_ = local_90 + 0x10;
    pcVar1 = (info->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + (info->name)._M_string_length);
    InternalException::InternalException<std::__cxx11::string>
              (pIVar4,(string *)(local_170 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)local_170);
  if (*(CatalogType *)((long)local_170 + 0x10) == (info->super_ParseInfo).field_0x9) {
    local_148._0_8_ = (pointer)0x0;
    local_148._8_8_ = (pointer)0x0;
    local_148._16_8_ = (pointer)0x0;
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::CatalogEntry,_true> *)local_170);
    if (*(CatalogType *)((long)local_170 + 0x10) == TABLE_ENTRY) {
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                ((optional_ptr<duckdb::CatalogEntry,_true> *)local_170);
      FindForeignKeyInformation
                ((TableCatalogEntry *)local_170,AFT_DELETE,
                 (vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
                  *)local_148);
    }
    local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.start_time;
    local_c8 = local_130.transaction.ptr;
    peStack_c0 = (element_type *)local_130.transaction_id;
    local_d8 = local_130.db.ptr;
    _Stack_d0._M_nxt = (_Hash_node_base *)local_130.context.ptr;
    this_03 = (DuckSchemaEntry *)local_170;
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::CatalogEntry,_true> *)this_03);
    transaction_01.context.ptr._0_4_ = (int)_Stack_d0._M_nxt;
    transaction_01.db.ptr = local_d8;
    transaction_01.context.ptr._4_4_ = (int)((ulong)_Stack_d0._M_nxt >> 0x20);
    transaction_01.transaction.ptr._0_4_ = (int)local_c8;
    transaction_01.transaction.ptr._4_4_ = (int)((ulong)local_c8 >> 0x20);
    transaction_01.transaction_id._0_4_ = (int)peStack_c0;
    transaction_01.transaction_id._4_4_ = (int)((ulong)peStack_c0 >> 0x20);
    transaction_01.start_time = (transaction_t)local_b8;
    OnDropEntry(this_03,transaction_01,(CatalogEntry *)local_170);
    transaction_02.context.ptr._0_4_ = (int)local_130.context.ptr;
    transaction_02.db.ptr = local_130.db.ptr;
    transaction_02.context.ptr._4_4_ = (int)((ulong)local_130.context.ptr >> 0x20);
    transaction_02.transaction.ptr._0_4_ = (int)local_130.transaction.ptr;
    transaction_02.transaction.ptr._4_4_ = (int)((ulong)local_130.transaction.ptr >> 0x20);
    transaction_02.transaction_id._0_4_ = (int)local_130.transaction_id;
    transaction_02.transaction_id._4_4_ = (int)(local_130.transaction_id >> 0x20);
    transaction_02.start_time = local_130.start_time;
    bVar2 = CatalogSet::DropEntry
                      (this_00,transaction_02,&info->name,info->cascade,info->allow_drop_internal);
    if (bVar2) {
      if (local_148._8_8_ != local_148._0_8_) {
        __n = 0;
        do {
          local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.start_time;
          VStack_100.hugeint.upper = (int64_t)local_130.transaction.ptr;
          peStack_f0 = (element_type *)local_130.transaction_id;
          local_108 = local_130.db.ptr;
          VStack_100.bigint = (int64_t)local_130.context.ptr;
          this_01 = vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
                                  *)local_148,__n);
          pAVar3 = unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>
                   ::operator*(this_01);
          (*(this->super_SchemaCatalogEntry).super_InCatalogEntry.super_CatalogEntry.
            _vptr_CatalogEntry[0x20])(this,pAVar3);
          __n = __n + 1;
        } while (__n < (ulong)((long)(local_148._8_8_ - local_148._0_8_) >> 3));
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
                 *)local_148);
      return;
    }
    pIVar4 = (InternalException *)__cxa_allocate_exception(0x10);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_170 + 8),"Could not drop element because of an internal error","");
    InternalException::InternalException(pIVar4,(string *)(local_170 + 8));
    __cxa_throw(pIVar4,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_02 = (CatalogException *)__cxa_allocate_exception(0x10);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_170 + 8),"Existing object %s is of type %s, trying to drop type %s",""
            );
  local_b0._0_8_ = local_b0 + 0x10;
  pcVar1 = (info->name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar1,pcVar1 + (info->name)._M_string_length);
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)local_170);
  CatalogTypeToString_abi_cxx11_
            (&local_50,(duckdb *)(ulong)*(CatalogType *)((long)local_170 + 0x10),type);
  CatalogTypeToString_abi_cxx11_
            (&local_70,(duckdb *)(ulong)(byte)(info->super_ParseInfo).field_0x9,type_00);
  CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_02,(string *)(local_170 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,&local_50
             ,&local_70);
  __cxa_throw(this_02,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DuckSchemaEntry::DropEntry(ClientContext &context, DropInfo &info) {
	auto &set = GetCatalogSet(info.type);

	// first find the entry
	auto transaction = GetCatalogTransaction(context);
	auto existing_entry = set.GetEntry(transaction, info.name);
	if (!existing_entry) {
		throw InternalException("Failed to drop entry \"%s\" - entry could not be found", info.name);
	}
	if (existing_entry->type != info.type) {
		throw CatalogException("Existing object %s is of type %s, trying to drop type %s", info.name,
		                       CatalogTypeToString(existing_entry->type), CatalogTypeToString(info.type));
	}

	vector<unique_ptr<AlterForeignKeyInfo>> fk_arrays;
	if (existing_entry->type == CatalogType::TABLE_ENTRY) {
		// if there is a foreign key constraint, get that information
		auto &table_entry = existing_entry->Cast<TableCatalogEntry>();
		FindForeignKeyInformation(table_entry, AlterForeignKeyType::AFT_DELETE, fk_arrays);
	}

	OnDropEntry(transaction, *existing_entry);
	if (!set.DropEntry(transaction, info.name, info.cascade, info.allow_drop_internal)) {
		throw InternalException("Could not drop element because of an internal error");
	}

	// remove the foreign key constraint in main key table if main key table's name is valid
	for (idx_t i = 0; i < fk_arrays.size(); i++) {
		// alter primary key table
		Alter(transaction, *fk_arrays[i]);
	}
}